

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O3

FT_Error TT_Process_Composite_Component
                   (TT_Loader loader,FT_SubGlyph subglyph,FT_UInt start_point,
                   FT_UInt num_base_points)

{
  ushort uVar1;
  FT_GlyphLoader pFVar2;
  FT_Vector *pFVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  FT_Fixed FVar7;
  FT_Fixed FVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong yOffset;
  ulong xOffset;
  long lVar12;
  undefined1 local_60 [8];
  FT_Outline current;
  
  pFVar2 = loader->gloader;
  current._0_8_ = (pFVar2->base).outline.points + num_base_points;
  local_60._2_2_ = (pFVar2->base).outline.n_points - (short)num_base_points;
  uVar1 = subglyph->flags;
  uVar4 = uVar1;
  current._32_8_ = loader;
  if ((uVar1 & 200) != 0) {
    FT_Outline_Transform((FT_Outline *)local_60,&subglyph->transform);
    uVar4 = subglyph->flags;
  }
  iVar10 = subglyph->arg1;
  iVar6 = subglyph->arg2;
  if ((uVar4 & 2) == 0) {
    uVar9 = iVar10 + start_point;
    if (num_base_points <= uVar9) {
      return 0x15;
    }
    uVar5 = iVar6 + num_base_points;
    if ((uint)(int)(pFVar2->base).outline.n_points <= uVar5) {
      return 0x15;
    }
    pFVar3 = (pFVar2->base).outline.points;
    xOffset = pFVar3[uVar9].x - pFVar3[uVar5].x;
    yOffset = pFVar3[uVar9].y - pFVar3[uVar5].y;
  }
  else {
    if (iVar10 == 0 && iVar6 == 0) {
      return 0;
    }
    if (((uVar1 & 200) != 0) && ((uVar4 & 0x800) != 0)) {
      FVar7 = FT_Hypot((subglyph->transform).xx,(subglyph->transform).xy);
      FVar8 = FT_Hypot((subglyph->transform).yy,(subglyph->transform).yx);
      lVar11 = (long)(int)FVar7 * (long)iVar10;
      iVar10 = (int)((ulong)(lVar11 + 0x8000 + (lVar11 >> 0x3f)) >> 0x10);
      lVar11 = (long)(int)FVar8 * (long)iVar6;
      iVar6 = (int)((ulong)(lVar11 + 0x8000 + (lVar11 >> 0x3f)) >> 0x10);
    }
    xOffset = (ulong)iVar10;
    yOffset = (ulong)iVar6;
    if ((*(ulong *)(current._32_8_ + 0x20) & 1) == 0) {
      lVar11 = *(long *)(*(long *)(current._32_8_ + 8) + 0x58);
      lVar12 = (long)*(int *)(lVar11 + 8) * xOffset;
      xOffset = (ulong)(int)((ulong)(lVar12 + 0x8000 + (lVar12 >> 0x3f)) >> 0x10);
      lVar11 = (long)*(int *)(lVar11 + 0x10) * yOffset;
      yOffset = (ulong)(int)((ulong)(lVar11 + 0x8000 + (lVar11 >> 0x3f)) >> 0x10);
      if (((*(ulong *)(current._32_8_ + 0x20) & 2) == 0) && ((subglyph->flags & 4) != 0)) {
        if (*(int *)(*(long *)(*(long *)current._32_8_ + 0xb0) + 0x78) == 0x23) {
          xOffset = xOffset + 0x20 & 0xffffffffffffffc0;
        }
        yOffset = yOffset + 0x20 & 0xffffffffffffffc0;
      }
    }
  }
  if (xOffset != 0 || yOffset != 0) {
    FT_Outline_Translate((FT_Outline *)local_60,xOffset,yOffset);
  }
  return 0;
}

Assistant:

static FT_Error
  TT_Process_Composite_Component( TT_Loader    loader,
                                  FT_SubGlyph  subglyph,
                                  FT_UInt      start_point,
                                  FT_UInt      num_base_points )
  {
    FT_GlyphLoader  gloader = loader->gloader;
    FT_Outline      current;
    FT_Bool         have_scale;
    FT_Pos          x, y;


    current.points   = gloader->base.outline.points +
                         num_base_points;
    current.n_points = gloader->base.outline.n_points -
                         (short)num_base_points;

    have_scale = FT_BOOL( subglyph->flags & ( WE_HAVE_A_SCALE     |
                                              WE_HAVE_AN_XY_SCALE |
                                              WE_HAVE_A_2X2       ) );

    /* perform the transform required for this subglyph */
    if ( have_scale )
      FT_Outline_Transform( &current, &subglyph->transform );

    /* get offset */
    if ( !( subglyph->flags & ARGS_ARE_XY_VALUES ) )
    {
      FT_UInt     num_points = (FT_UInt)gloader->base.outline.n_points;
      FT_UInt     k = (FT_UInt)subglyph->arg1;
      FT_UInt     l = (FT_UInt)subglyph->arg2;
      FT_Vector*  p1;
      FT_Vector*  p2;


      /* match l-th point of the newly loaded component to the k-th point */
      /* of the previously loaded components.                             */

      /* change to the point numbers used by our outline */
      k += start_point;
      l += num_base_points;
      if ( k >= num_base_points ||
           l >= num_points      )
        return FT_THROW( Invalid_Composite );

      p1 = gloader->base.outline.points + k;
      p2 = gloader->base.outline.points + l;

      x = p1->x - p2->x;
      y = p1->y - p2->y;
    }
    else
    {
      x = subglyph->arg1;
      y = subglyph->arg2;

      if ( !x && !y )
        return FT_Err_Ok;

      /* Use a default value dependent on                                  */
      /* TT_CONFIG_OPTION_COMPONENT_OFFSET_SCALED.  This is useful for old */
      /* TT fonts which don't set the xxx_COMPONENT_OFFSET bit.            */

      if ( have_scale &&
#ifdef TT_CONFIG_OPTION_COMPONENT_OFFSET_SCALED
           !( subglyph->flags & UNSCALED_COMPONENT_OFFSET ) )
#else
            ( subglyph->flags & SCALED_COMPONENT_OFFSET ) )
#endif
      {

#if 0

        /*******************************************************************/
        /*                                                                 */
        /* This algorithm is what Apple documents.  But it doesn't work.   */
        /*                                                                 */
        int  a = subglyph->transform.xx > 0 ?  subglyph->transform.xx
                                            : -subglyph->transform.xx;
        int  b = subglyph->transform.yx > 0 ?  subglyph->transform.yx
                                            : -subglyph->transform.yx;
        int  c = subglyph->transform.xy > 0 ?  subglyph->transform.xy
                                            : -subglyph->transform.xy;
        int  d = subglyph->transform.yy > 0 ?  subglyph->transform.yy
                                            : -subglyph->transform.yy;
        int  m = a > b ? a : b;
        int  n = c > d ? c : d;


        if ( a - b <= 33 && a - b >= -33 )
          m *= 2;
        if ( c - d <= 33 && c - d >= -33 )
          n *= 2;
        x = FT_MulFix( x, m );
        y = FT_MulFix( y, n );

#else /* 1 */

        /*******************************************************************/
        /*                                                                 */
        /* This algorithm is a guess and works much better than the above. */
        /*                                                                 */
        FT_Fixed  mac_xscale = FT_Hypot( subglyph->transform.xx,
                                         subglyph->transform.xy );
        FT_Fixed  mac_yscale = FT_Hypot( subglyph->transform.yy,
                                         subglyph->transform.yx );


        x = FT_MulFix( x, mac_xscale );
        y = FT_MulFix( y, mac_yscale );

#endif /* 1 */

      }

      if ( !( loader->load_flags & FT_LOAD_NO_SCALE ) )
      {
        FT_Fixed  x_scale = loader->size->metrics->x_scale;
        FT_Fixed  y_scale = loader->size->metrics->y_scale;


        x = FT_MulFix( x, x_scale );
        y = FT_MulFix( y, y_scale );

        if ( subglyph->flags & ROUND_XY_TO_GRID )
        {
          TT_Face    face   = loader->face;
          TT_Driver  driver = (TT_Driver)FT_FACE_DRIVER( face );


          if ( IS_HINTED( loader->load_flags ) )
          {
            /*
             * We round the horizontal offset only if there is hinting along
             * the x axis; this corresponds to integer advance width values.
             *
             * Theoretically, a glyph's bytecode can toggle ClearType's
             * `backward compatibility' mode, which would allow modification
             * of the advance width.  In reality, however, applications
             * neither allow nor expect modified advance widths if sub-pixel
             * rendering is active.
             *
             */
            if ( driver->interpreter_version == TT_INTERPRETER_VERSION_35 )
              x = FT_PIX_ROUND( x );

            y = FT_PIX_ROUND( y );
          }
        }
      }
    }

    if ( x || y )
      FT_Outline_Translate( &current, x, y );

    return FT_Err_Ok;
  }